

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

SourceCodeInfo_Location * __thiscall
google::protobuf::FileDescriptorTables::GetSourceLocation
          (FileDescriptorTables *this,vector<int,_std::allocator<int>_> *path,SourceCodeInfo *info)

{
  second_type pSVar1;
  char *in_RCX;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*> p;
  string sStack_48;
  pair<const_google::protobuf::FileDescriptorTables_*,_const_google::protobuf::SourceCodeInfo_*>
  local_28;
  
  local_28.first = this;
  local_28.second = info;
  GoogleOnceInit<std::pair<google::protobuf::FileDescriptorTables_const*,google::protobuf::SourceCodeInfo_const*>>
            (&(this->locations_by_path_once_).state_,BuildLocationsByPath,&local_28);
  Join<std::vector<int,std::allocator<int>>>
            (&sStack_48,(protobuf *)path,(vector<int,_std::allocator<int>_> *)0x3508d3,in_RCX);
  pSVar1 = FindPtrOrNull<google::protobuf::hash_map<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*,google::protobuf::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>>
                     (&this->locations_by_path_,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return pSVar1;
}

Assistant:

const SourceCodeInfo_Location* FileDescriptorTables::GetSourceLocation(
    const std::vector<int>& path, const SourceCodeInfo* info) const {
  std::pair<const FileDescriptorTables*, const SourceCodeInfo*> p(
      std::make_pair(this, info));
  locations_by_path_once_.Init(&FileDescriptorTables::BuildLocationsByPath, &p);
  return FindPtrOrNull(locations_by_path_, Join(path, ","));
}